

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void phosg::print_data(FILE *stream,vector<iovec,_std::allocator<iovec>_> *iovs,
                      uint64_t start_address,vector<iovec,_std::allocator<iovec>_> *prev_iovs,
                      uint64_t flags)

{
  iovec *piVar1;
  size_type sVar2;
  iovec *prev_iovs_00;
  size_type num_prev_iovs;
  uint64_t flags_local;
  vector<iovec,_std::allocator<iovec>_> *prev_iovs_local;
  uint64_t start_address_local;
  vector<iovec,_std::allocator<iovec>_> *iovs_local;
  FILE *stream_local;
  
  if (prev_iovs == (vector<iovec,_std::allocator<iovec>_> *)0x0) {
    piVar1 = ::std::vector<iovec,_std::allocator<iovec>_>::data(iovs);
    sVar2 = ::std::vector<iovec,_std::allocator<iovec>_>::size(iovs);
    print_data(stream,piVar1,sVar2,start_address,(iovec *)0x0,0,flags);
  }
  else {
    piVar1 = ::std::vector<iovec,_std::allocator<iovec>_>::data(iovs);
    sVar2 = ::std::vector<iovec,_std::allocator<iovec>_>::size(iovs);
    prev_iovs_00 = ::std::vector<iovec,_std::allocator<iovec>_>::data(prev_iovs);
    num_prev_iovs = ::std::vector<iovec,_std::allocator<iovec>_>::size(prev_iovs);
    print_data(stream,piVar1,sVar2,start_address,prev_iovs_00,num_prev_iovs,flags);
  }
  return;
}

Assistant:

void print_data(
    FILE* stream,
    const vector<struct iovec>& iovs,
    uint64_t start_address,
    const vector<struct iovec>* prev_iovs,
    uint64_t flags) {
  if (prev_iovs) {
    print_data(stream, iovs.data(), iovs.size(), start_address,
        prev_iovs->data(), prev_iovs->size(), flags);
  } else {
    print_data(stream, iovs.data(), iovs.size(), start_address, nullptr, 0,
        flags);
  }
}